

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::deleteContents
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this)

{
  Entry *pEVar1;
  long *plVar2;
  PtexCachedReader *pPVar3;
  size_t i_1;
  long lVar4;
  uint32_t i;
  ulong uVar5;
  _Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
  local_48;
  
  lVar4 = 0x18;
  for (uVar5 = 0; pEVar1 = this->_entries, uVar5 < this->_numEntries; uVar5 = uVar5 + 1) {
    if ((*(long *)((long)&(pEVar1->key)._val + lVar4) != 0) &&
       (plVar2 = *(long **)((long)&(this->_entries->key)._val + lVar4), plVar2 != (long *)0x0)) {
      (**(code **)(*plVar2 + 8))();
    }
    lVar4 = lVar4 + 0x20;
  }
  if (pEVar1 != (Entry *)0x0) {
    pPVar3 = pEVar1[-1].value;
    if (pPVar3 != (PtexCachedReader *)0x0) {
      lVar4 = (long)pPVar3 << 5;
      do {
        StringKey::~StringKey((StringKey *)((long)&pEVar1[-1].key._val + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
    operator_delete__(&pEVar1[-1].value,(long)pPVar3 << 5 | 8);
  }
  uVar5 = 0;
  while( true ) {
    local_48._M_impl.super__Vector_impl_data._M_start =
         (this->_oldEntries).
         super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         (this->_oldEntries).
         super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) break;
    pEVar1 = local_48._M_impl.super__Vector_impl_data._M_start[uVar5];
    if (pEVar1 != (Entry *)0x0) {
      pPVar3 = pEVar1[-1].value;
      if (pPVar3 != (PtexCachedReader *)0x0) {
        lVar4 = (long)pPVar3 << 5;
        do {
          StringKey::~StringKey((StringKey *)((long)&pEVar1[-1].key._val + lVar4));
          lVar4 = lVar4 + -0x20;
        } while (lVar4 != 0);
      }
      operator_delete__(&pEVar1[-1].value,(long)pPVar3 << 5 | 8);
    }
    uVar5 = uVar5 + 1;
  }
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->_oldEntries).
       super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void deleteContents()
    {
        for (uint32_t i = 0; i < _numEntries; ++i) {
            if (_entries[i].value) delete _entries[i].value;
        }
        delete [] _entries;
        for (size_t i = 0; i < _oldEntries.size(); ++i) {
            delete [] _oldEntries[i];
        }
        std::vector<Entry*>().swap(_oldEntries);
    }